

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_object.cpp
# Opt level: O3

date_time *
mjs::anon_unknown_37::date_helper::date_time_from_time(date_time *__return_storage_ptr__,double t)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  tm *ptVar8;
  time_t tt;
  long local_10;
  
  local_10 = (long)(t / 1000.0);
  ptVar8 = gmtime(&local_10);
  uVar1 = ptVar8->tm_min;
  uVar3 = ptVar8->tm_hour;
  iVar5 = ptVar8->tm_sec;
  __return_storage_ptr__->year = (double)(ptVar8->tm_year + 0x76c);
  uVar2 = ptVar8->tm_mday;
  uVar4 = ptVar8->tm_mon;
  auVar6._8_4_ = SUB84((double)(int)uVar2,0);
  auVar6._0_8_ = (double)(int)uVar4;
  auVar6._12_4_ = (int)((ulong)(double)(int)uVar2 >> 0x20);
  __return_storage_ptr__->month = (double)(int)uVar4;
  __return_storage_ptr__->day = (double)auVar6._8_8_;
  auVar7._8_4_ = SUB84((double)(int)uVar1,0);
  auVar7._0_8_ = (double)(int)uVar3;
  auVar7._12_4_ = (int)((ulong)(double)(int)uVar1 >> 0x20);
  __return_storage_ptr__->h = (double)(int)uVar3;
  __return_storage_ptr__->m = (double)auVar7._8_8_;
  __return_storage_ptr__->s = (double)iVar5;
  __return_storage_ptr__->ms = (double)((long)t % 1000);
  return (date_time *)(((long)t / 1000) * 1000);
}

Assistant:

static date_time date_time_from_time(double t) {
        const auto tm = tm_from_time(t);
        return {
            static_cast<double>(tm.tm_year+1900), static_cast<double>(tm.tm_mon), static_cast<double>(tm.tm_mday),
            static_cast<double>(tm.tm_hour), static_cast<double>(tm.tm_min), static_cast<double>(tm.tm_sec), static_cast<double>(ms_from_time(t))
        };
    }